

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator=(TPZFMatrix<Fad<float>_> *this,Fad<float> *value)

{
  long lVar1;
  Fad<float> *pFVar2;
  
  lVar1 = (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  if (0 < lVar1) {
    pFVar2 = this->fElem;
    do {
      pFVar2->val_ = value->val_;
      Vector<float>::operator=(&pFVar2->dx_,&value->dx_);
      pFVar2->defaultVal = value->defaultVal;
      pFVar2 = pFVar2 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return this;
}

Assistant:

TPZFMatrix<TVar>& TPZFMatrix<TVar>::operator=(const TVar value ) {
    int64_t size = ((int64_t)this->fRow) * this->fCol;
    TVar * dst   = fElem;
    for ( int64_t i = 0; i < size; i++ )
        *dst++ = value;
    this->fDecomposed = 0;
    return *this;
}